

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QString,_QChar>,_const_char_(&)[12]>,_ProString>::
~QStringBuilder(QStringBuilder<QStringBuilder<QStringBuilder<QString,_QChar>,_const_char_(&)[12]>,_ProString>
                *this)

{
  ProString::~ProString((ProString *)0x13cac0);
  QStringBuilder<QStringBuilder<QString,_QChar>,_const_char_(&)[12]>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QString,_QChar>,_const_char_(&)[12]> *)0x13caca);
  return;
}

Assistant:

~QStringBuilder() = default;